

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void curve_motionfn(void *z,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  float fVar1;
  t_scalar *sc;
  _glist *owner;
  t_template *template;
  int iVar2;
  _instancecanvas *p_Var3;
  t_symbol *s;
  _instancetemplate *p_Var4;
  _fielddesc *f;
  t_atom at;
  
  if ((up == 0.0) && (!NAN(up))) {
    f = (_fielddesc *)
        ((long)*(int *)(pd_maininstance.pd_gui)->i_template * 0x28 + *(long *)((long)z + 0xe0));
    iVar2 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0x48),0);
    p_Var3 = pd_maininstance.pd_gui;
    if (iVar2 == 0) {
      post("curve_motion: scalar disappeared");
      return;
    }
    p_Var4 = (pd_maininstance.pd_gui)->i_template;
    fVar1 = *(float *)(p_Var4 + 4);
    *(float *)(p_Var4 + 4) = fVar1 + dx;
    *(float *)(p_Var4 + 0x10) = *(float *)(p_Var4 + 0x10) + dy;
    if (((dx != 0.0) || (NAN(dx))) && (f->fd_var != '\0')) {
      fielddesc_setcoord(f,*(t_template **)(p_Var4 + 0x40),*(t_word **)(p_Var4 + 0x38),
                         (fVar1 + dx) * *(float *)(p_Var4 + 0xc) + *(float *)(p_Var4 + 8),1);
      p_Var3 = pd_maininstance.pd_gui;
    }
    if (((dy != 0.0) || (NAN(dy))) && (f[1].fd_var != '\0')) {
      p_Var4 = p_Var3->i_template;
      fielddesc_setcoord(f + 1,*(t_template **)(p_Var4 + 0x40),*(t_word **)(p_Var4 + 0x38),
                         *(float *)(p_Var4 + 0x10) * *(float *)(p_Var4 + 0x18) +
                         *(float *)(p_Var4 + 0x14),1);
      p_Var3 = pd_maininstance.pd_gui;
    }
    p_Var4 = p_Var3->i_template;
    sc = *(t_scalar **)(p_Var4 + 0x28);
    if (sc != (t_scalar *)0x0) {
      owner = *(_glist **)(p_Var4 + 0x20);
      template = *(t_template **)(p_Var4 + 0x40);
      s = gensym("change");
      template_notifyforscalar(template,owner,sc,s,1,&at);
      p_Var4 = (pd_maininstance.pd_gui)->i_template;
      if (*(t_scalar **)(p_Var4 + 0x28) != (t_scalar *)0x0) {
        scalar_redraw(*(t_scalar **)(p_Var4 + 0x28),*(_glist **)(p_Var4 + 0x20));
        p_Var4 = (pd_maininstance.pd_gui)->i_template;
      }
    }
    if (*(_array **)(p_Var4 + 0x30) != (_array *)0x0) {
      array_redraw(*(_array **)(p_Var4 + 0x30),*(_glist **)(p_Var4 + 0x20));
    }
  }
  return;
}

Assistant:

static void curve_motionfn(void *z, t_floatarg dx, t_floatarg dy, t_floatarg up)
{
    t_curve *x = (t_curve *)z;
    t_fielddesc *f = x->x_vec + TEMPLATE->curve_motion_field;
    t_atom at;
    if (up != 0)
        return;
    if (!gpointer_check(&TEMPLATE->curve_motion_gpointer, 0))
    {
        post("curve_motion: scalar disappeared");
        return;
    }
    TEMPLATE->curve_motion_xcumulative += dx;
    TEMPLATE->curve_motion_ycumulative += dy;
    if (f->fd_var && (dx != 0))
    {
        fielddesc_setcoord(f, TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_wp,
            TEMPLATE->curve_motion_xbase +
            TEMPLATE->curve_motion_xcumulative * TEMPLATE->curve_motion_xper,
                1);
    }
    if ((f+1)->fd_var && (dy != 0))
    {
        fielddesc_setcoord(f+1, TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_wp,
            TEMPLATE->curve_motion_ybase +
            TEMPLATE->curve_motion_ycumulative * TEMPLATE->curve_motion_yper,
                1);
    }
        /* LATER figure out what to do to notify for an array? */
    if (TEMPLATE->curve_motion_scalar)
        template_notifyforscalar(TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_glist,
            TEMPLATE->curve_motion_scalar, gensym("change"), 1, &at);
    if (TEMPLATE->curve_motion_scalar)
        scalar_redraw(TEMPLATE->curve_motion_scalar,
            TEMPLATE->curve_motion_glist);
    if (TEMPLATE->curve_motion_array)
        array_redraw(TEMPLATE->curve_motion_array,
            TEMPLATE->curve_motion_glist);
}